

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int sort(lua_State *L)

{
  int iVar1;
  ulong uVar2;
  
  checktab(L,1,7);
  uVar2 = luaL_len(L,1);
  if (1 < (long)uVar2) {
    if (0x7ffffffe < uVar2) {
      luaL_argerror(L,1,"array too big");
    }
    iVar1 = lua_type(L,2);
    if (0 < iVar1) {
      luaL_checktype(L,2,6);
    }
    lua_settop(L,2);
    auxsort(L,1,(IdxT)uVar2,0);
  }
  return 0;
}

Assistant:

static int sort(lua_State *L) {
    lua_Integer n = aux_getn(L, 1, TAB_RW);
    if (n > 1) {  /* non-trivial interval? */
        luaL_argcheck(L, n < INT_MAX, 1, "array too big");
        if (!lua_isnoneornil(L, 2))  /* is there a 2nd argument? */
            luaL_checktype(L, 2, LUA_TFUNCTION);  /* must be a function */
        lua_settop(L, 2);  /* make sure there are two arguments */
        auxsort(L, 1, (IdxT) n, 0);
    }
    return 0;
}